

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

char * nullcDebugGetInstructionSourceLocation(uint instruction)

{
  ExternSourceInfo *pEVar1;
  uint local_2c;
  uint i;
  char *fullSource;
  ExternSourceInfo *sourceInfo;
  uint infoSize;
  uint instruction_local;
  
  sourceInfo._0_4_ = 0;
  sourceInfo._4_4_ = instruction;
  pEVar1 = nullcDebugSourceInfo((uint *)&sourceInfo);
  if ((uint)sourceInfo == 0) {
    _infoSize = (char *)0x0;
  }
  else {
    _infoSize = nullcDebugSource();
    for (local_2c = 0; local_2c < (uint)sourceInfo; local_2c = local_2c + 1) {
      if (sourceInfo._4_4_ == pEVar1[local_2c].instruction) {
        return _infoSize + pEVar1[local_2c].sourceOffset;
      }
      if ((local_2c + 1 < (uint)sourceInfo) && (sourceInfo._4_4_ < pEVar1[local_2c + 1].instruction)
         ) {
        return _infoSize + pEVar1[local_2c].sourceOffset;
      }
    }
    _infoSize = _infoSize + pEVar1[(uint)sourceInfo - 1].sourceOffset;
  }
  return _infoSize;
}

Assistant:

const char* nullcDebugGetInstructionSourceLocation(unsigned instruction)
{
	unsigned infoSize = 0;
	ExternSourceInfo *sourceInfo = nullcDebugSourceInfo(&infoSize);

	if(!infoSize)
		return NULL;

	const char *fullSource = nullcDebugSource();

	for(unsigned i = 0; i < infoSize; i++)
	{
		if(instruction == sourceInfo[i].instruction)
			return fullSource + sourceInfo[i].sourceOffset;

		if(i + 1 < infoSize && instruction < sourceInfo[i + 1].instruction)
			return fullSource + sourceInfo[i].sourceOffset;
	}

	return fullSource + sourceInfo[infoSize - 1].sourceOffset;
}